

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O1

void __thiscall cmCTestBZR::LogParser::~LogParser(LogParser *this)

{
  LogParser *this_00;
  
  this_00 = (LogParser *)(this[-1].EmailRegex.regmatch.endp + 8);
  ~LogParser(this_00);
  operator_delete(this_00,0x298);
  return;
}

Assistant:

int InitializeParser() override
  {
    int res = this->cmXMLParser::InitializeParser();
    if (res) {
      XML_SetUnknownEncodingHandler(static_cast<XML_Parser>(this->Parser),
                                    cmBZRXMLParserUnknownEncodingHandler,
                                    nullptr);
    }
    return res;
  }